

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void resume(lua_State *L,void *ud)

{
  StkId pSVar1;
  CallInfo *ci_00;
  CallInfo *ci;
  StkId firstArg;
  int n;
  void *ud_local;
  lua_State *L_local;
  
  firstArg._4_4_ = *ud;
  pSVar1 = (L->top).p;
  ci_00 = L->ci;
  if (L->status == '\0') {
    ccall(L,pSVar1 + -(long)firstArg._4_4_ + -1,-1,0);
  }
  else {
    L->status = '\0';
    if ((ci_00->callstatus & 0x8000) == 0) {
      (ci_00->u).l.savedpc = (Instruction *)((ci_00->u).c.k + -4);
      (L->top).p = pSVar1 + -(long)firstArg._4_4_;
      luaV_execute(L,ci_00);
    }
    else {
      if ((ci_00->u).l.savedpc != (Instruction *)0x0) {
        firstArg._4_4_ = (*(ci_00->u).c.k)(L,1,(ci_00->u).c.ctx);
      }
      luaD_poscall(L,ci_00,firstArg._4_4_);
    }
    unroll(L,(void *)0x0);
  }
  return;
}

Assistant:

static void resume (lua_State *L, void *ud) {
  int n = *(cast(int*, ud));  /* number of arguments */
  StkId firstArg = L->top.p - n;  /* first argument */
  CallInfo *ci = L->ci;
  if (L->status == LUA_OK)  /* starting a coroutine? */
    ccall(L, firstArg - 1, LUA_MULTRET, 0);  /* just call its body */
  else {  /* resuming from previous yield */
    lua_assert(L->status == LUA_YIELD);
    L->status = LUA_OK;  /* mark that it is running (again) */
    if (isLua(ci)) {  /* yielded inside a hook? */
      /* undo increment made by 'luaG_traceexec': instruction was not
         executed yet */
      lua_assert(ci->callstatus & CIST_HOOKYIELD);
      ci->u.l.savedpc--;
      L->top.p = firstArg;  /* discard arguments */
      luaV_execute(L, ci);  /* just continue running Lua code */
    }
    else {  /* 'common' yield */
      if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
        lua_unlock(L);
        n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
        lua_lock(L);
        api_checknelems(L, n);
      }
      luaD_poscall(L, ci, n);  /* finish 'luaD_call' */
    }
    unroll(L, NULL);  /* run continuation */
  }
}